

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O0

int mpi_write_hlp(mbedtls_mpi *X,int radix,char **p,size_t buflen)

{
  int iVar1;
  int iVar2;
  mbedtls_mpi *in_RCX;
  mbedtls_mpi *in_RDX;
  int in_ESI;
  mbedtls_mpi *in_RDI;
  char *p_end;
  size_t length;
  mbedtls_mpi_uint r;
  int ret;
  void *local_48;
  mbedtls_mpi *local_40;
  ulong in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  
  local_40 = (mbedtls_mpi *)0x0;
  local_48 = (void *)((long)&in_RCX->p + (long)in_RDX->p);
  do {
    if (in_RCX <= local_40) {
      return -8;
    }
    iVar1 = mbedtls_mpi_mod_int((mbedtls_mpi_uint *)&stack0xffffffffffffffc8,in_RDI,(long)in_ESI);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_div_int(in_RDX,in_RCX,(mbedtls_mpi *)(ulong)in_stack_ffffffffffffffd0,
                                in_stack_ffffffffffffffc8);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (in_stack_ffffffffffffffc8 < 10) {
      *(char *)((long)local_48 + -1) = (char)in_stack_ffffffffffffffc8 + '0';
    }
    else {
      *(char *)((long)local_48 + -1) = (char)in_stack_ffffffffffffffc8 + '7';
    }
    local_48 = (void *)((long)local_48 + -1);
    local_40 = (mbedtls_mpi *)((long)&local_40->p + 1);
    iVar2 = mbedtls_mpi_cmp_int((mbedtls_mpi *)(ulong)in_stack_ffffffffffffffd0,
                                in_stack_ffffffffffffffc8);
  } while (iVar2 != 0);
  memmove(in_RDX->p,local_48,(size_t)local_40);
  in_RDX->p = (mbedtls_mpi_uint *)((long)&local_40->p + (long)in_RDX->p);
  return iVar1;
}

Assistant:

static int mpi_write_hlp(mbedtls_mpi *X, int radix,
                         char **p, const size_t buflen)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi_uint r;
    size_t length = 0;
    char *p_end = *p + buflen;

    do {
        if (length >= buflen) {
            return MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL;
        }

        MBEDTLS_MPI_CHK(mbedtls_mpi_mod_int(&r, X, radix));
        MBEDTLS_MPI_CHK(mbedtls_mpi_div_int(X, NULL, X, radix));
        /*
         * Write the residue in the current position, as an ASCII character.
         */
        if (r < 0xA) {
            *(--p_end) = (char) ('0' + r);
        } else {
            *(--p_end) = (char) ('A' + (r - 0xA));
        }

        length++;
    } while (mbedtls_mpi_cmp_int(X, 0) != 0);

    memmove(*p, p_end, length);
    *p += length;

cleanup:

    return ret;
}